

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alignment.h
# Opt level: O0

void __thiscall llvm::Align::Align(Align *this,uint64_t Value)

{
  bool bVar1;
  uint uVar2;
  uint64_t Value_local;
  Align *this_local;
  
  this->ShiftValue = '\0';
  if (Value == 0) {
    __assert_fail("Value > 0 && \"Value must not be 0\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Alignment.h"
                  ,0x4e,"llvm::Align::Align(uint64_t)");
  }
  bVar1 = isPowerOf2_64(Value);
  if (!bVar1) {
    __assert_fail("llvm::isPowerOf2_64(Value) && \"Alignment is not a power of 2\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Alignment.h"
                  ,0x4f,"llvm::Align::Align(uint64_t)");
  }
  uVar2 = Log2_64(Value);
  this->ShiftValue = (uint8_t)uVar2;
  if (0x3f < this->ShiftValue) {
    __assert_fail("ShiftValue < 64 && \"Broken invariant\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Alignment.h"
                  ,0x51,"llvm::Align::Align(uint64_t)");
  }
  return;
}

Assistant:

explicit Align(uint64_t Value) {
    assert(Value > 0 && "Value must not be 0");
    assert(llvm::isPowerOf2_64(Value) && "Alignment is not a power of 2");
    ShiftValue = Log2_64(Value);
    assert(ShiftValue < 64 && "Broken invariant");
  }